

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O1

bool __thiscall TypeOp::markExplicitUnsigned(TypeOp *this,PcodeOp *op,int4 slot)

{
  type_metatype tVar1;
  Varnode *this_00;
  pointer ppVVar2;
  Varnode *this_01;
  HighVariable *pHVar3;
  PcodeOp *pPVar4;
  
  if ((this->addlflags & 1) == 0) {
    return false;
  }
  if (((slot == 1 & (byte)((this->addlflags & 2) >> 1)) == 0) &&
     (this_00 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start[slot], (this_00->flags & 2) != 0)) {
    pHVar3 = Varnode::getHigh(this_00);
    HighVariable::updateType(pHVar3);
    tVar1 = pHVar3->type->metatype;
    if (((tVar1 == TYPE_UNKNOWN) || (tVar1 == TYPE_UINT)) && ((pHVar3->type->flags & 0x36) == 0)) {
      ppVVar2 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if ((((long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)ppVVar2 & 0x7fffffff8U) == 0x10) &&
         ((this->addlflags & 2) == 0)) {
        pHVar3 = Varnode::getHigh(ppVVar2[1 - slot]);
        HighVariable::updateType(pHVar3);
        tVar1 = pHVar3->type->metatype;
        if (tVar1 == TYPE_UINT) {
          return false;
        }
        if (tVar1 == TYPE_UNKNOWN) {
          return false;
        }
      }
      this_01 = op->output;
      if ((this_01 == (Varnode *)0x0) ||
         (((this_01->flags & 0x80) == 0 &&
          ((pPVar4 = Varnode::loneDescend(this_01), pPVar4 == (PcodeOp *)0x0 ||
           ((pPVar4->opcode->addlflags & 1) != 0)))))) {
        *(byte *)&this_00->addlflags = (byte)this_00->addlflags | 0x40;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool TypeOp::markExplicitUnsigned(PcodeOp *op,int4 slot) const

{
  if ((addlflags & inherits_sign)==0) return false;
  if ((slot==1) && ((addlflags & inherits_sign_zero)!=0)) return false;
  Varnode *vn = op->getIn(slot);
  if (!vn->isConstant()) return false;
  Datatype *dt = vn->getHigh()->getType();
  type_metatype meta = dt->getMetatype();
  if ((meta != TYPE_UINT)&&(meta != TYPE_UNKNOWN)) return false;
  if (dt->isCharPrint()) return false;
  if (dt->isEnumType()) return false;
  if ((op->numInput() == 2) && ((addlflags & inherits_sign_zero)==0)) {
    Varnode *firstvn = op->getIn(1-slot);
    meta = firstvn->getHigh()->getType()->getMetatype();
    if ((meta == TYPE_UINT)||(meta == TYPE_UNKNOWN))
      return false;		// Other side of the operation will force the unsigned
  }
  // Check if type is going to get forced anyway
  Varnode *outvn = op->getOut();
  if (outvn != (Varnode *)0) {
    if (outvn->isExplicit()) return false;
    PcodeOp *lone = outvn->loneDescend();
    if (lone != (PcodeOp *)0) {
      if (!lone->inheritsSign()) return false;
    }
  }

  vn->setUnsignedPrint();
  return true;
}